

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O0

void __thiscall QFbVtHandler::~QFbVtHandler(QFbVtHandler *this)

{
  QFbVtHandler *in_RDI;
  
  ~QFbVtHandler(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

QFbVtHandler::~QFbVtHandler()
{
#ifdef VTH_ENABLED
    setKeyboardEnabled(true);
    setTTYCursor(true);

    if (m_signalNotifier) {
        close(m_sigFd[0]);
        close(m_sigFd[1]);
    }
#endif
}